

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_stream_data_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  undefined1 *puVar1;
  uint8_t *end;
  bool bVar2;
  int iVar3;
  uint64_t stream_id;
  uint64_t uVar4;
  quicly_stream_t *stream;
  int iVar5;
  
  end = state->end;
  stream_id = ptls_decode_quicint(&state->src,end);
  if (stream_id != 0xffffffffffffffff) {
    uVar4 = ptls_decode_quicint(&state->src,end);
    if (uVar4 != 0xffffffffffffffff) {
      iVar5 = 0;
      bVar2 = true;
      goto LAB_00127e85;
    }
  }
  iVar5 = 0x20007;
  bVar2 = false;
LAB_00127e85:
  if ((bVar2) &&
     (((stream_id & 0x8000000000000002) != 2 ||
      (iVar5 = 0x20007, (((uint)(conn->super).local.bidi.next_stream_id ^ (uint)stream_id) & 1) != 0
      )))) {
    stream = quicly_get_stream(conn,stream_id);
    iVar5 = 0;
    if (stream != (quicly_stream_t *)0x0) {
      puVar1 = &(stream->_send_aux).max_stream_data_sender.field_0x18;
      *puVar1 = *puVar1 | 1;
      iVar3 = should_send_max_stream_data(stream);
      iVar5 = 0;
      if (iVar3 != 0) {
        sched_stream_control(stream);
      }
    }
  }
  return iVar5;
}

Assistant:

static int handle_stream_data_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_data_blocked_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stream_data_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(STREAM_DATA_BLOCKED_RECEIVE, conn, conn->stash.now, frame.stream_id, frame.offset);

    if (!quicly_stream_has_receive_side(quicly_is_client(conn), frame.stream_id))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((stream = quicly_get_stream(conn, frame.stream_id)) != NULL) {
        quicly_maxsender_request_transmit(&stream->_send_aux.max_stream_data_sender);
        if (should_send_max_stream_data(stream))
            sched_stream_control(stream);
    }

    return 0;
}